

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O0

void __thiscall
ft::deque<int,_ft::allocator<int>_>::deque
          (deque<int,_ft::allocator<int>_> *this,allocator_type *alloc)

{
  allocator_type *alloc_local;
  deque<int,_ft::allocator<int>_> *this_local;
  
  dequeIterator<int,_64UL>::dequeIterator(&this->m_start);
  dequeIterator<int,_64UL>::dequeIterator(&this->m_finish);
  this->m_map = (map_pointer)0x0;
  this->m_map_size = 0;
  this->m_chunks = 0;
  this->m_size = 0;
  allocator<int>::allocator((allocator<int> *)&this->field_0x70,alloc);
  dequeInit(this,0);
  return;
}

Assistant:

explicit deque(allocator_type const & alloc = allocator_type()):
		m_map(NULL),
		m_map_size(0),
		m_chunks(0),
		m_size(0),
		m_alloc(alloc) {
		this->dequeInit(0);
	}